

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O2

void CVmBifNet::get_launch_host_addr(uint oargc)

{
  char *str;
  
  CVmBif::check_argc(oargc,0);
  if (G_net_config_X != (TadsNetConfig *)0x0) {
    str = TadsNetConfig::get(G_net_config_X,"hostname");
    if (str != (char *)0x0) {
      CVmBif::retval_str(str);
      return;
    }
  }
  CVmBif::retval_nil();
  return;
}

Assistant:

void CVmBifNet::get_launch_host_addr(VMG_ uint oargc)
{
    /* check arguments */
    check_argc(vmg_ oargc, 0);

    /* get the launch host name from the network configuration */
    const char *host = (G_net_config != 0
                        ? G_net_config->get("hostname")
                        : 0);

    /* if there's a host name, return it, otherwise return nil */
    if (host != 0)
        retval_str(vmg_ host);
    else
        retval_nil(vmg0_);
}